

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

UEnumeration *
ucal_getKeywordValuesForLocale_63(char *param_1,char *locale,UBool commonlyUsed,UErrorCode *status)

{
  int iVar1;
  UList *list;
  UBool UVar2;
  int32_t iVar3;
  UChar *us;
  char *pcVar4;
  size_t sVar5;
  UEnumeration *en;
  int32_t i_1;
  char *caltype;
  UChar *type;
  int32_t len;
  int i;
  UList *values;
  UResourceBundle *order;
  UResourceBundle *rb;
  UErrorCode *pUStack_30;
  char prefRegion [4];
  UErrorCode *status_local;
  UBool commonlyUsed_local;
  char *locale_local;
  char *param_0_local;
  
  pUStack_30 = status;
  ulocimp_getRegionForSupplementalData_63(locale,'\x01',(char *)((long)&rb + 4),4,status);
  order = ures_openDirect_63((char *)0x0,"supplementalData",pUStack_30);
  ures_getByKey_63(order,"calendarPreferenceData",order,pUStack_30);
  values = (UList *)ures_getByKey_63(order,(char *)((long)&rb + 4),(UResourceBundle *)0x0,pUStack_30
                                    );
  if ((*pUStack_30 == U_MISSING_RESOURCE_ERROR) && (order != (UResourceBundle *)0x0)) {
    *pUStack_30 = U_ZERO_ERROR;
    values = (UList *)ures_getByKey_63(order,"001",(UResourceBundle *)0x0,pUStack_30);
  }
  _len = (UList *)0x0;
  UVar2 = U_SUCCESS(*pUStack_30);
  if (UVar2 != '\0') {
    _len = ulist_createEmptyList_63(pUStack_30);
    UVar2 = U_SUCCESS(*pUStack_30);
    if (UVar2 != '\0') {
      for (type._4_4_ = 0; iVar1 = type._4_4_, iVar3 = ures_getSize_63((UResourceBundle *)values),
          iVar1 < iVar3; type._4_4_ = type._4_4_ + 1) {
        us = ures_getStringByIndex_63
                       ((UResourceBundle *)values,type._4_4_,(int32_t *)&type,pUStack_30);
        pcVar4 = (char *)uprv_malloc_63((long)((int)type + 1));
        if (pcVar4 == (char *)0x0) {
          *pUStack_30 = U_MEMORY_ALLOCATION_ERROR;
          break;
        }
        u_UCharsToChars_63(us,pcVar4,(int)type);
        pcVar4[(int)type] = '\0';
        ulist_addItemEndList_63(_len,pcVar4,'\x01',pUStack_30);
        UVar2 = U_FAILURE(*pUStack_30);
        if (UVar2 != '\0') break;
      }
      UVar2 = U_SUCCESS(*pUStack_30);
      if ((UVar2 != '\0') && (commonlyUsed == '\0')) {
        for (en._4_4_ = 0; list = _len, CAL_TYPES[en._4_4_] != (char *)0x0; en._4_4_ = en._4_4_ + 1)
        {
          pcVar4 = CAL_TYPES[en._4_4_];
          sVar5 = strlen(CAL_TYPES[en._4_4_]);
          UVar2 = ulist_containsString_63(list,pcVar4,(int32_t)sVar5);
          if (UVar2 == '\0') {
            ulist_addItemEndList_63(_len,CAL_TYPES[en._4_4_],'\0',pUStack_30);
            UVar2 = U_FAILURE(*pUStack_30);
            if (UVar2 != '\0') break;
          }
        }
      }
      UVar2 = U_FAILURE(*pUStack_30);
      if (UVar2 != '\0') {
        ulist_deleteList_63(_len);
        _len = (UList *)0x0;
      }
    }
  }
  ures_close_63((UResourceBundle *)values);
  ures_close_63(order);
  UVar2 = U_FAILURE(*pUStack_30);
  if ((UVar2 == '\0') && (_len != (UList *)0x0)) {
    param_0_local = (char *)uprv_malloc_63(0x38);
    if (param_0_local == (char *)0x0) {
      *pUStack_30 = U_MEMORY_ALLOCATION_ERROR;
      ulist_deleteList_63(_len);
      param_0_local = (char *)0x0;
    }
    else {
      ulist_resetList_63(_len);
      memcpy(param_0_local,&defaultKeywordValues,0x38);
      *(UList **)(param_0_local + 8) = _len;
    }
  }
  else {
    param_0_local = (char *)0x0;
  }
  return (UEnumeration *)param_0_local;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ucal_getKeywordValuesForLocale(const char * /* key */, const char* locale, UBool commonlyUsed, UErrorCode *status) {
    // Resolve region
    char prefRegion[ULOC_COUNTRY_CAPACITY];
    (void)ulocimp_getRegionForSupplementalData(locale, TRUE, prefRegion, sizeof(prefRegion), status);
    
    // Read preferred calendar values from supplementalData calendarPreference
    UResourceBundle *rb = ures_openDirect(NULL, "supplementalData", status);
    ures_getByKey(rb, "calendarPreferenceData", rb, status);
    UResourceBundle *order = ures_getByKey(rb, prefRegion, NULL, status);
    if (*status == U_MISSING_RESOURCE_ERROR && rb != NULL) {
        *status = U_ZERO_ERROR;
        order = ures_getByKey(rb, "001", NULL, status);
    }

    // Create a list of calendar type strings
    UList *values = NULL;
    if (U_SUCCESS(*status)) {
        values = ulist_createEmptyList(status);
        if (U_SUCCESS(*status)) {
            for (int i = 0; i < ures_getSize(order); i++) {
                int32_t len;
                const UChar *type = ures_getStringByIndex(order, i, &len, status);
                char *caltype = (char*)uprv_malloc(len + 1);
                if (caltype == NULL) {
                    *status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                u_UCharsToChars(type, caltype, len);
                *(caltype + len) = 0;

                ulist_addItemEndList(values, caltype, TRUE, status);
                if (U_FAILURE(*status)) {
                    break;
                }
            }

            if (U_SUCCESS(*status) && !commonlyUsed) {
                // If not commonlyUsed, add other available values
                for (int32_t i = 0; CAL_TYPES[i] != NULL; i++) {
                    if (!ulist_containsString(values, CAL_TYPES[i], (int32_t)uprv_strlen(CAL_TYPES[i]))) {
                        ulist_addItemEndList(values, CAL_TYPES[i], FALSE, status);
                        if (U_FAILURE(*status)) {
                            break;
                        }
                    }
                }
            }
            if (U_FAILURE(*status)) {
                ulist_deleteList(values);
                values = NULL;
            }
        }
    }

    ures_close(order);
    ures_close(rb);

    if (U_FAILURE(*status) || values == NULL) {
        return NULL;
    }

    // Create string enumeration
    UEnumeration *en = (UEnumeration*)uprv_malloc(sizeof(UEnumeration));
    if (en == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        ulist_deleteList(values);
        return NULL;
    }
    ulist_resetList(values);
    memcpy(en, &defaultKeywordValues, sizeof(UEnumeration));
    en->context = values;
    return en;
}